

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expertInline.hpp
# Opt level: O0

void __thiscall FastLinearExpert::queryNewPredXVar(FastLinearExpert *this,Z *z,Scal hNorm)

{
  StorageBaseType *matrix;
  NoAlias<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::MatrixBase> other;
  double *in_RDI;
  double in_XMM0_Qa;
  double dVar1;
  double dVar2;
  ReturnType RVar3;
  ReturnType RVar4;
  Matrix<double,__1,_1,_0,__1,_1> *this_00;
  double dVar5;
  double dVar6;
  double dVar7;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> PVar8
  ;
  Scal p;
  Scal o;
  Scal n;
  Scal m;
  Scal k;
  Scal i;
  Scal e;
  Scal dd;
  Scal c;
  Scal b;
  Scal a;
  Z g;
  Z f;
  Z newSz;
  Scal newSh;
  Scal decay;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
  *in_stack_fffffffffffffce8;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_stack_fffffffffffffcf0;
  Matrix<double,__1,_1,_0,__1,_1> *in_stack_fffffffffffffd00;
  MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
  *in_stack_fffffffffffffd08;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *in_stack_fffffffffffffd10;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *in_stack_fffffffffffffd18;
  StorageBaseType *in_stack_fffffffffffffd30;
  
  dVar1 = pow(in_RDI[0x10] + in_XMM0_Qa,in_RDI[0x20]);
  dVar2 = pow(in_RDI[0x10],in_RDI[0x20]);
  dVar2 = (dVar1 - in_XMM0_Qa) / dVar2;
  dVar1 = dVar2 * in_RDI[0x11] + in_XMM0_Qa;
  Eigen::operator*(in_RDI,in_stack_fffffffffffffd30);
  Eigen::operator*(in_RDI,in_stack_fffffffffffffd30);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>
  ::operator+(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffcf0,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
              *)in_stack_fffffffffffffce8);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(in_stack_fffffffffffffd00);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(in_stack_fffffffffffffd00);
  PVar8 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                    ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                     in_stack_fffffffffffffcf0,
                     (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                     in_stack_fffffffffffffce8);
  matrix = (StorageBaseType *)PVar8.m_lhs;
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::noalias
            ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffce8);
  Eigen::NoAlias<Eigen::Matrix<double,-1,1,0,-1,1>,Eigen::MatrixBase>::operator=
            ((NoAlias<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::MatrixBase> *)
             in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  PVar8 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                    ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                     in_stack_fffffffffffffcf0,
                     (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                     in_stack_fffffffffffffce8);
  other = Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::noalias
                    ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                     in_stack_fffffffffffffce8);
  Eigen::NoAlias<Eigen::Matrix<double,-1,1,0,-1,1>,Eigen::MatrixBase>::operator=
            ((NoAlias<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::MatrixBase> *)PVar8.m_rhs,
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
              *)other.m_expression);
  RVar3 = Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
          dot<Eigen::Matrix<double,_1,1,0,_1,1>>
                    (in_stack_fffffffffffffcf0,
                     (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                     in_stack_fffffffffffffce8);
  RVar4 = Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
          dot<Eigen::Matrix<double,_1,1,0,_1,1>>
                    (in_stack_fffffffffffffcf0,
                     (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                     in_stack_fffffffffffffce8);
  this_00 = (Matrix<double,__1,_1,_0,__1,_1> *)
            Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
            dot<Eigen::Matrix<double,_1,1,0,_1,1>>
                      (in_stack_fffffffffffffcf0,
                       (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                       in_stack_fffffffffffffce8);
  dVar5 = dVar2 / in_XMM0_Qa + RVar3;
  dVar6 = 1.0 - RVar3 / dVar5;
  dVar5 = (double)this_00 - RVar4 * (RVar4 / dVar5);
  dVar7 = RVar4 * dVar6 * dVar1 - dVar5;
  in_RDI[0x34] = 1.0 / dVar1 +
                 (RVar3 * dVar6 +
                 ((dVar5 + (dVar7 * dVar7) / (dVar2 * dVar1 - dVar5)) / dVar1 -
                 (RVar4 + RVar4) * dVar6) / dVar1) / dVar2;
  Eigen::operator*(in_RDI,matrix);
  Eigen::operator*(in_RDI,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>
  ::operator+((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
               *)PVar8.m_lhs,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
               *)PVar8.m_rhs);
  Eigen::Matrix<double,-1,1,0,-1,1>::operator=(this_00,in_stack_fffffffffffffce8);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x3037eb);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x3037fa);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x303809);
  return;
}

Assistant:

EXPERT_CLASS_TEMPLATE
void FAST_LINEAR_EXPERT_base::queryNewPredXVar(Z const &z, Scal hNorm)
{
    Scal decay = (pow(H+hNorm,alpha) - hNorm) / pow(H,alpha);

    Scal newSh = decay * Sh + hNorm;
    Z newSz = decay * Sz + hNorm * z;

    Z f,g;
    f.noalias() = invSzz * z;
    g.noalias() = invSzz * newSz;

    Scal a = f.dot( z );
    Scal b = g.dot( z );
    Scal c = g.dot( newSz );

    Scal dd = decay / hNorm + a;
    Scal e = 1.0 - a / dd;
    Scal i = b / dd;
    Scal k = c - b*i;
    Scal m = b*e*newSh - k;
    Scal n = decay * newSh - k;

    newGamma = 1.0 / newSh + (a*e + ((k+m*m/n)/newSh-2*b*e)/newSh)/decay;

    Scal o = (m/n - 1.0)/newSh;
    Scal p = (hNorm-i)*o*o;

    dNewGamma = (2.0*(e*(e+(hNorm-2*i)*o)-i*p)/decay) * f + (2.0*(e*o+p)/decay)*g;
}